

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileParser::getTwoVectors3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_a,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_b)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  aiVector3t<float> local_44;
  aiVector3t<float> local_38;
  ai_real local_2c;
  ai_real local_28;
  ai_real z;
  ai_real y;
  ai_real x;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_b_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_a_local;
  ObjFileParser *this_local;
  
  _y = point3d_array_b;
  point3d_array_b_local = point3d_array_a;
  point3d_array_a_local = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this;
  copyNextWord(this,this->m_buffer,0x1000);
  z = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_28 = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_2c = fast_atof(this->m_buffer);
  pvVar1 = point3d_array_b_local;
  aiVector3t<float>::aiVector3t(&local_38,z,local_28,local_2c);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(pvVar1,&local_38);
  copyNextWord(this,this->m_buffer,0x1000);
  z = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_28 = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_2c = fast_atof(this->m_buffer);
  pvVar1 = _y;
  aiVector3t<float>::aiVector3t(&local_44,z,local_28,local_2c);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(pvVar1,&local_44);
  _Var2 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var2._M_current;
  return;
}

Assistant:

void ObjFileParser::getTwoVectors3( std::vector<aiVector3D> &point3d_array_a, std::vector<aiVector3D> &point3d_array_b ) {
    ai_real x, y, z;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array_a.push_back( aiVector3D( x, y, z ) );

    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array_b.push_back( aiVector3D( x, y, z ) );

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}